

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostAddress_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::HostAddress::Clear(HostAddress *this)

{
  this->m_protocol = UnknownNetworkProtocol;
  this->m_ip4Address = 0;
  (this->m_ip6Address).data[0] = '\0';
  (this->m_ip6Address).data[1] = '\0';
  (this->m_ip6Address).data[2] = '\0';
  (this->m_ip6Address).data[3] = '\0';
  (this->m_ip6Address).data[4] = '\0';
  (this->m_ip6Address).data[5] = '\0';
  (this->m_ip6Address).data[6] = '\0';
  (this->m_ip6Address).data[7] = '\0';
  (this->m_ip6Address).data[8] = '\0';
  (this->m_ip6Address).data[9] = '\0';
  (this->m_ip6Address).data[10] = '\0';
  (this->m_ip6Address).data[0xb] = '\0';
  (this->m_ip6Address).data[0xc] = '\0';
  (this->m_ip6Address).data[0xd] = '\0';
  (this->m_ip6Address).data[0xe] = '\0';
  (this->m_ip6Address).data[0xf] = '\0';
  (this->m_ipString)._M_string_length = 0;
  *(this->m_ipString)._M_dataplus._M_p = '\0';
  this->m_hasIpAddress = true;
  return;
}

Assistant:

void HostAddress::Clear()
{

    m_protocol = HostAddress::UnknownNetworkProtocol;
    m_ip4Address = 0;
    m_ip6Address = IPv6Address();
    m_ipString.clear();

    // this may feel funny, but cleared IP (equivalent to '0.0.0.0') is technically valid
    // and that's not really what this flag is checking anyway
    //
    // this flag is false *iff* the string passed in is a 'plain-text' hostname (www.foo.bar)
    m_hasIpAddress = true;
}